

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audioio.cpp
# Opt level: O0

int GetAudioLength(char *filename)

{
  int iVar1;
  size_t sVar2;
  int local_38;
  int local_34;
  int i;
  int wav_length;
  int nbit;
  undefined1 auStack_24 [3];
  uchar for_int_number [4];
  char data_check [5];
  FILE *fp;
  char *filename_local;
  
  register0x00000000 = fopen(filename,"rb");
  if (register0x00000000 == (FILE *)0x0) {
    filename_local._4_4_ = 0;
  }
  else {
    iVar1 = anon_unknown.dwarf_a85f::CheckHeader((FILE *)register0x00000000);
    if (iVar1 == 0) {
      fclose(stack0xffffffffffffffe0);
      filename_local._4_4_ = -1;
    }
    else {
      memset((void *)((long)&nbit + 3),0,5);
      for_int_number[0] = '\0';
      fseek(stack0xffffffffffffffe0,10,1);
      fread((void *)((long)&wav_length + 3),1,2,stack0xffffffffffffffe0);
      while (sVar2 = fread((void *)((long)&nbit + 3),1,1,stack0xffffffffffffffe0), sVar2 != 0) {
        if (nbit._3_1_ == 'd') {
          fread(auStack_24,1,3,stack0xffffffffffffffe0);
          iVar1 = strcmp((char *)((long)&nbit + 3),"data");
          if (iVar1 == 0) break;
          fseek(stack0xffffffffffffffe0,-3,1);
        }
      }
      iVar1 = strcmp((char *)((long)&nbit + 3),"data");
      if (iVar1 == 0) {
        fread((void *)((long)&wav_length + 3),1,4,stack0xffffffffffffffe0);
        fclose(stack0xffffffffffffffe0);
        local_34 = 0;
        for (local_38 = 3; -1 < local_38; local_38 = local_38 + -1) {
          local_34 = local_34 * 0x100 + (uint)*(byte *)((long)&wav_length + (long)local_38 + 3);
        }
        filename_local._4_4_ = local_34 / (int)(wav_length._3_1_ / 8);
      }
      else {
        fclose(stack0xffffffffffffffe0);
        filename_local._4_4_ = -1;
      }
    }
  }
  return filename_local._4_4_;
}

Assistant:

int GetAudioLength(const char *filename) {
  FILE *fp = fopen(filename, "rb");
  if (NULL == fp) {
    return 0;
  }

  if (0 == CheckHeader(fp)) {
    fclose(fp);
    return -1;
  }

  char data_check[5] = { 0 };
  data_check[4] = '\0';
  unsigned char for_int_number[4];

  // Quantization
  fseek(fp, 10, SEEK_CUR);
  fread(for_int_number, 1, 2, fp);
  int nbit = for_int_number[0];

  while (0 != fread(data_check, 1, 1, fp)) {
    if ('d' == data_check[0]) {
      fread(&data_check[1], 1, 3, fp);
      if (0 != strcmp(data_check, "data"))
        fseek(fp, -3, SEEK_CUR);
      else
        break;
    }
  }
  if (0 != strcmp(data_check, "data")) {
    fclose(fp);
    return -1;
  }

  fread(for_int_number, 1, 4, fp);  // "data"
  fclose(fp);

  int wav_length = 0;
  for (int i = 3; i >= 0; --i)
    wav_length = wav_length * 256 + for_int_number[i];
  wav_length /= (nbit / 8);

  return wav_length;
}